

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::RelayAddress
          (PeerManagerImpl *this,NodeId originator,CAddress *addr,bool fReachable)

{
  bool bVar1;
  uint uVar2;
  CSipHasher *__src;
  uint64_t uVar3;
  PeerManagerImpl *this_00;
  PeerManagerImpl *pPVar4;
  type *ptVar5;
  iterator pvVar6;
  reference pvVar7;
  byte in_CL;
  long in_RSI;
  long in_FS_OFFSET;
  pair<unsigned_long,_(anonymous_namespace)::Peer_*> pVar8;
  uint i_1;
  uint i;
  type *peer;
  type *id;
  map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  *__range1;
  uint nRelayNodes;
  uint64_t time_addr;
  uint64_t hash_addr;
  uint64_t hashKey;
  iterator __end1;
  iterator __begin1;
  duration<long,_std::ratio<1L,_1L>_> current_time;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock50;
  array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL> best;
  CSipHasher hasher;
  seconds in_stack_fffffffffffffdc8;
  CAddress *in_stack_fffffffffffffdd0;
  uint7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  Peer *in_stack_fffffffffffffde0;
  CConnman *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  CSipHasher *in_stack_fffffffffffffdf8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffe00;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffe08;
  uint64_t uVar9;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  Peer *peer_00;
  uint local_1ac;
  uint local_1a8;
  pointer local_8;
  
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  if (((in_CL & 1) != 0) ||
     (bVar1 = CNetAddr::IsRelayable
                        ((CNetAddr *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8)),
     bVar1)) {
    CServiceHash::CServiceHash
              ((CServiceHash *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               (uint64_t)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8.__r);
    CServiceHash::operator()
              ((CServiceHash *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               &in_stack_fffffffffffffdd0->super_CService);
    GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
    count_seconds(in_stack_fffffffffffffdc8);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffdd0,
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffffdc8.__r);
    count_seconds(in_stack_fffffffffffffdc8);
    CConnman::GetDeterministicRandomizer
              (in_stack_fffffffffffffde8,(uint64_t)in_stack_fffffffffffffde0);
    CSipHasher::Write(in_stack_fffffffffffffdf8,(uint64_t)in_stack_fffffffffffffdf0);
    __src = CSipHasher::Write(in_stack_fffffffffffffdf8,(uint64_t)in_stack_fffffffffffffdf0);
    memcpy(&stack0xffffffffffffffc8,__src,0x30);
    bVar1 = true;
    if ((in_CL & 1) == 0) {
      uVar3 = CSipHasher::Finalize(in_stack_fffffffffffffdf8);
      bVar1 = (uVar3 & 1) != 0;
    }
    uVar2 = 1;
    if (bVar1) {
      uVar2 = 2;
    }
    peer_00 = (Peer *)&stack0xffffffffffffff78;
    std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>::pair<int,_std::nullptr_t,_true>
              ((pair<unsigned_long,_(anonymous_namespace)::Peer_*> *)
               CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               (int *)in_stack_fffffffffffffdd0,(void **)in_stack_fffffffffffffdc8.__r);
    std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>::pair<int,_std::nullptr_t,_true>
              ((pair<unsigned_long,_(anonymous_namespace)::Peer_*> *)
               CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               (int *)in_stack_fffffffffffffdd0,(void **)in_stack_fffffffffffffdc8.__r);
    this_00 = (PeerManagerImpl *)(ulong)uVar2;
    pPVar4 = (PeerManagerImpl *)
             std::array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL>::size
                       ((array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL> *)
                        in_stack_fffffffffffffdc8.__r);
    if (pPVar4 < this_00) {
      __assert_fail("nRelayNodes <= best.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                    ,0x968,
                    "void (anonymous namespace)::PeerManagerImpl::RelayAddress(NodeId, const CAddress &, bool)"
                   );
    }
    MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffdc8.__r);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8
               ,in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffde8 >> 0x18,0));
    std::
    map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
    ::begin((map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
             *)in_stack_fffffffffffffdd0);
    std::
    map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
    ::end((map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
           *)in_stack_fffffffffffffdd0);
    pVar8.second = in_stack_fffffffffffffde0;
    pVar8.first = (unsigned_long)in_stack_fffffffffffffde8;
    while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffddf,
                                                     in_stack_fffffffffffffdd8),
                                   (_Self *)in_stack_fffffffffffffdd0), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      std::_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>
                   *)in_stack_fffffffffffffdc8.__r);
      ptVar5 = std::get<0ul,long_const,std::shared_ptr<(anonymous_namespace)::Peer>>
                         ((pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_> *)
                          in_stack_fffffffffffffdc8.__r);
      std::get<1ul,long_const,std::shared_ptr<(anonymous_namespace)::Peer>>
                ((pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_> *)
                 in_stack_fffffffffffffdc8.__r);
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffdc8.__r);
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)pVar8.second);
      if ((bVar1) && (*ptVar5 != in_RSI)) {
        std::
        __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
        in_stack_fffffffffffffe27 =
             IsAddrCompatible((Peer *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                              in_stack_fffffffffffffdd0);
        if ((bool)in_stack_fffffffffffffe27) {
          CSipHasher::Write(in_stack_fffffffffffffdf8,(uint64_t)in_stack_fffffffffffffdf0);
          uVar3 = CSipHasher::Finalize(in_stack_fffffffffffffdf8);
          for (local_1a8 = 0; local_1a8 < uVar2; local_1a8 = local_1a8 + 1) {
            uVar9 = uVar3;
            pvVar7 = std::array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL>::
                     operator[]((array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL>
                                 *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                                (size_type)in_stack_fffffffffffffdd0);
            if (pvVar7->first < uVar9) {
              in_stack_fffffffffffffdf0 = &stack0xffffffffffffff78;
              pvVar6 = std::array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL>::
                       begin((array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL> *)
                             in_stack_fffffffffffffdc8.__r);
              in_stack_fffffffffffffdf8 = (CSipHasher *)(pvVar6 + local_1a8);
              std::array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL>::begin
                        ((array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL> *)
                         in_stack_fffffffffffffdc8.__r);
              std::array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL>::begin
                        ((array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL> *)
                         in_stack_fffffffffffffdc8.__r);
              std::
              copy<std::pair<unsigned_long,(anonymous_namespace)::Peer*>*,std::pair<unsigned_long,(anonymous_namespace)::Peer*>*>
                        ((pair<unsigned_long,_(anonymous_namespace)::Peer_*> *)pVar8.first,
                         (pair<unsigned_long,_(anonymous_namespace)::Peer_*> *)pVar8.second,
                         (pair<unsigned_long,_(anonymous_namespace)::Peer_*> *)
                         CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
              std::__shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2> *)
                         in_stack_fffffffffffffdc8.__r);
              pVar8 = std::make_pair<unsigned_long&,(anonymous_namespace)::Peer*>
                                ((unsigned_long *)
                                 CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                                 (Peer **)in_stack_fffffffffffffdd0);
              std::array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL>::operator[]
                        ((array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL> *)
                         CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                         (size_type)in_stack_fffffffffffffdd0);
              std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>::operator=
                        ((pair<unsigned_long,_(anonymous_namespace)::Peer_*> *)
                         CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                         (type)in_stack_fffffffffffffdd0);
              break;
            }
          }
        }
      }
      std::_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>
                    *)in_stack_fffffffffffffdc8.__r);
    }
    local_1ac = 0;
    while( true ) {
      bVar1 = false;
      if (local_1ac < uVar2) {
        pvVar7 = std::array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL>::
                 operator[]((array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL> *)
                            (ulong)in_stack_fffffffffffffdd8,(size_type)in_stack_fffffffffffffdd0);
        bVar1 = pvVar7->first != 0;
      }
      if (bVar1 == false) break;
      std::array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL>::operator[]
                ((array<std::pair<unsigned_long,_(anonymous_namespace)::Peer_*>,_2UL> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffdd8),(size_type)in_stack_fffffffffffffdd0);
      PushAddress(this_00,peer_00,
                  (CAddress *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
      local_1ac = local_1ac + 1;
    }
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffdc8.__r);
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::RelayAddress(NodeId originator,
                                   const CAddress& addr,
                                   bool fReachable)
{
    // We choose the same nodes within a given 24h window (if the list of connected
    // nodes does not change) and we don't relay to nodes that already know an
    // address. So within 24h we will likely relay a given address once. This is to
    // prevent a peer from unjustly giving their address better propagation by sending
    // it to us repeatedly.

    if (!fReachable && !addr.IsRelayable()) return;

    // Relay to a limited number of other nodes
    // Use deterministic randomness to send to the same nodes for 24 hours
    // at a time so the m_addr_knowns of the chosen nodes prevent repeats
    const uint64_t hash_addr{CServiceHash(0, 0)(addr)};
    const auto current_time{GetTime<std::chrono::seconds>()};
    // Adding address hash makes exact rotation time different per address, while preserving periodicity.
    const uint64_t time_addr{(static_cast<uint64_t>(count_seconds(current_time)) + hash_addr) / count_seconds(ROTATE_ADDR_RELAY_DEST_INTERVAL)};
    const CSipHasher hasher{m_connman.GetDeterministicRandomizer(RANDOMIZER_ID_ADDRESS_RELAY)
                                .Write(hash_addr)
                                .Write(time_addr)};

    // Relay reachable addresses to 2 peers. Unreachable addresses are relayed randomly to 1 or 2 peers.
    unsigned int nRelayNodes = (fReachable || (hasher.Finalize() & 1)) ? 2 : 1;

    std::array<std::pair<uint64_t, Peer*>, 2> best{{{0, nullptr}, {0, nullptr}}};
    assert(nRelayNodes <= best.size());

    LOCK(m_peer_mutex);

    for (auto& [id, peer] : m_peer_map) {
        if (peer->m_addr_relay_enabled && id != originator && IsAddrCompatible(*peer, addr)) {
            uint64_t hashKey = CSipHasher(hasher).Write(id).Finalize();
            for (unsigned int i = 0; i < nRelayNodes; i++) {
                 if (hashKey > best[i].first) {
                     std::copy(best.begin() + i, best.begin() + nRelayNodes - 1, best.begin() + i + 1);
                     best[i] = std::make_pair(hashKey, peer.get());
                     break;
                 }
            }
        }
    };

    for (unsigned int i = 0; i < nRelayNodes && best[i].first != 0; i++) {
        PushAddress(*best[i].second, addr);
    }
}